

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::HavingBinder::BindWindow
          (BindResult *__return_storage_ptr__,HavingBinder *this,WindowExpression *expr,idx_t depth)

{
  allocator local_49;
  BinderException local_48;
  string local_38;
  
  ::std::__cxx11::string::string
            ((string *)&local_38,"HAVING clause cannot contain window functions!",&local_49);
  BinderException::Unsupported(&local_48,&expr->super_ParsedExpression,&local_38);
  BindResult::BindResult(__return_storage_ptr__,&local_48.super_Exception);
  ::std::runtime_error::~runtime_error((runtime_error *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

BindResult HavingBinder::BindWindow(WindowExpression &expr, idx_t depth) {
	return BindResult(BinderException::Unsupported(expr, "HAVING clause cannot contain window functions!"));
}